

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

group * clipp::operator_(group *__return_storage_ptr__,group *a,group *b)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  __type _Var4;
  group local_f8;
  group local_b0;
  group local_68;
  
  if (a->scoped_ == false) {
    bVar3 = group::blocking(a);
    if ((((!bVar3) && (a->exclusive_ == false)) &&
        ((a->super_token<clipp::group>).repeatable_ == false)) && (a->joinable_ == false)) {
      if ((a->super_token<clipp::group>).doc_._M_string_length != 0) {
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)b);
        if (!_Var4) goto LAB_0010f047;
      }
      std::
      vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
      ::emplace_back<clipp::group>(&a->children_,b);
      bVar3 = false;
      goto LAB_0010f167;
    }
  }
LAB_0010f047:
  local_f8.super_token<clipp::group>.doc_._M_dataplus._M_p =
       (pointer)&local_f8.super_token<clipp::group>.doc_.field_2;
  paVar1 = &(a->super_token<clipp::group>).doc_.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(a->super_token<clipp::group>).doc_._M_dataplus._M_p;
  if (paVar2 == paVar1) {
    local_f8.super_token<clipp::group>.doc_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_f8.super_token<clipp::group>.doc_.field_2._8_8_ =
         *(undefined8 *)((long)&(a->super_token<clipp::group>).doc_.field_2 + 8);
  }
  else {
    local_f8.super_token<clipp::group>.doc_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_f8.super_token<clipp::group>.doc_._M_dataplus._M_p = (pointer)paVar2;
  }
  local_f8.super_token<clipp::group>.doc_._M_string_length =
       (a->super_token<clipp::group>).doc_._M_string_length;
  (a->super_token<clipp::group>).doc_._M_dataplus._M_p = (pointer)paVar1;
  (a->super_token<clipp::group>).doc_._M_string_length = 0;
  (a->super_token<clipp::group>).doc_.field_2._M_local_buf[0] = '\0';
  local_f8.super_token<clipp::group>.repeatable_ = (a->super_token<clipp::group>).repeatable_;
  local_f8.super_token<clipp::group>.blocking_ = (a->super_token<clipp::group>).blocking_;
  local_f8.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (a->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_f8.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (a->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_f8.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (a->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  local_b0.super_token<clipp::group>.doc_._M_dataplus._M_p =
       (pointer)&local_b0.super_token<clipp::group>.doc_.field_2;
  local_f8.scoped_ = a->scoped_;
  local_f8.exclusive_ = a->exclusive_;
  local_f8.joinable_ = a->joinable_;
  paVar1 = &(b->super_token<clipp::group>).doc_.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(b->super_token<clipp::group>).doc_._M_dataplus._M_p;
  if (paVar2 == paVar1) {
    local_b0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_b0.super_token<clipp::group>.doc_.field_2._8_8_ =
         *(undefined8 *)((long)&(b->super_token<clipp::group>).doc_.field_2 + 8);
  }
  else {
    local_b0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_b0.super_token<clipp::group>.doc_._M_dataplus._M_p = (pointer)paVar2;
  }
  local_b0.super_token<clipp::group>.doc_._M_string_length =
       (b->super_token<clipp::group>).doc_._M_string_length;
  (b->super_token<clipp::group>).doc_._M_dataplus._M_p = (pointer)paVar1;
  (b->super_token<clipp::group>).doc_._M_string_length = 0;
  (b->super_token<clipp::group>).doc_.field_2._M_local_buf[0] = '\0';
  local_b0.super_token<clipp::group>.repeatable_ = (b->super_token<clipp::group>).repeatable_;
  local_b0.super_token<clipp::group>.blocking_ = (b->super_token<clipp::group>).blocking_;
  local_b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (b->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (b->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  local_b0.scoped_ = b->scoped_;
  local_b0.exclusive_ = b->exclusive_;
  local_b0.joinable_ = b->joinable_;
  a = &local_68;
  group::group<clipp::group>(a,&local_f8,&local_b0);
  bVar3 = true;
  local_68.scoped_ = false;
LAB_0010f167:
  group::group(__return_storage_ptr__,a);
  if (bVar3) {
    std::
    vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
    ::~vector(&local_68.children_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.super_token<clipp::group>.doc_._M_dataplus._M_p !=
        &local_68.super_token<clipp::group>.doc_.field_2) {
      operator_delete(local_68.super_token<clipp::group>.doc_._M_dataplus._M_p);
    }
    std::
    vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
    ::~vector(&local_b0.children_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.super_token<clipp::group>.doc_._M_dataplus._M_p !=
        &local_b0.super_token<clipp::group>.doc_.field_2) {
      operator_delete(local_b0.super_token<clipp::group>.doc_._M_dataplus._M_p);
    }
    std::
    vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
    ::~vector(&local_f8.children_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.super_token<clipp::group>.doc_._M_dataplus._M_p !=
        &local_f8.super_token<clipp::group>.doc_.field_2) {
      operator_delete(local_f8.super_token<clipp::group>.doc_._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator , (group a, group b)
{
    return !a.scoped() && !a.blocking() && !a.exclusive() && !a.repeatable()
        && !a.joinable() && (a.doc().empty() || a.doc() == b.doc())
       ? a.push_back(std::move(b))
       : group{std::move(a), std::move(b)}.scoped(false);
}